

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive_impl.h
# Opt level: O2

int secp256k1_hardened_nonce_function_smallint
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  secp256k1_scalar s;
  
  secp256k1_scalar_set_int(&s,*data);
  secp256k1_scalar_get_b32(nonce32,&s);
  return 1;
}

Assistant:

static int secp256k1_hardened_nonce_function_smallint(unsigned char *nonce32, const unsigned char *msg,
                                                      size_t msglen,
                                                      const unsigned char *key32, const unsigned char *xonly_pk32,
                                                      const unsigned char *algo, size_t algolen,
                                                      void* data) {
    secp256k1_scalar s;
    int *idata = data;
    (void)msg;
    (void)msglen;
    (void)key32;
    (void)xonly_pk32;
    (void)algo;
    (void)algolen;
    secp256k1_scalar_set_int(&s, *idata);
    secp256k1_scalar_get_b32(nonce32, &s);
    return 1;
}